

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

ssize_t __thiscall fmp4_stream::emsg::write(emsg *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  uint32_t in;
  int iVar2;
  int iVar3;
  long lVar4;
  size_type sVar5;
  const_reference pvVar6;
  undefined4 in_register_00000034;
  int local_28;
  uint32_t sz;
  uint32_t bytes_written;
  char long_buf [8];
  char int_buf [4];
  ostream *ostr_local;
  emsg *this_local;
  
  register0x00000030 = (char *)CONCAT44(in_register_00000034,__fd);
  in = (**(this->super_full_box).super_box._vptr_box)();
  anon_unknown.dwarf_23239::fmp4_write_uint32(in,long_buf);
  std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
  std::ostream::put((char)stack0xffffffffffffffe8);
  std::ostream::put((char)stack0xffffffffffffffe8);
  std::ostream::put((char)stack0xffffffffffffffe8);
  std::ostream::put((char)stack0xffffffffffffffe8);
  std::ostream::put((char)stack0xffffffffffffffe8);
  std::ostream::put((char)stack0xffffffffffffffe8);
  std::ostream::put((char)stack0xffffffffffffffe8);
  std::ostream::put((char)stack0xffffffffffffffe8);
  pcVar1 = stack0xffffffffffffffe8;
  if ((this->super_full_box).super_box.field_0x62 == '\x01') {
    anon_unknown.dwarf_23239::fmp4_write_uint32(this->timescale_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    anon_unknown.dwarf_23239::fmp4_write_uint64(this->presentation_time_,(char *)&sz);
    std::ostream::write(stack0xffffffffffffffe8,(long)&sz);
    anon_unknown.dwarf_23239::fmp4_write_uint32(this->event_duration_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    anon_unknown.dwarf_23239::fmp4_write_uint32(this->id_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    pcVar1 = stack0xffffffffffffffe8;
    lVar4 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write(pcVar1,lVar4);
    iVar2 = std::__cxx11::string::size();
    pcVar1 = stack0xffffffffffffffe8;
    lVar4 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write(pcVar1,lVar4);
    local_28 = std::__cxx11::string::size();
    local_28 = local_28 + iVar2 + 0x22;
  }
  else {
    lVar4 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write(pcVar1,lVar4);
    iVar2 = std::__cxx11::string::size();
    pcVar1 = stack0xffffffffffffffe8;
    lVar4 = std::__cxx11::string::c_str();
    std::__cxx11::string::size();
    std::ostream::write(pcVar1,lVar4);
    iVar3 = std::__cxx11::string::size();
    anon_unknown.dwarf_23239::fmp4_write_uint32(this->timescale_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    anon_unknown.dwarf_23239::fmp4_write_uint32(this->presentation_time_delta_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    anon_unknown.dwarf_23239::fmp4_write_uint32(this->event_duration_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    anon_unknown.dwarf_23239::fmp4_write_uint32(this->id_,long_buf);
    std::ostream::write(stack0xffffffffffffffe8,(long)long_buf);
    local_28 = iVar3 + iVar2 + 0x1e;
  }
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
  pcVar1 = stack0xffffffffffffffe8;
  if (sVar5 != 0) {
    pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->message_data_,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
    std::ostream::write(pcVar1,(long)pvVar6);
  }
  sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->message_data_);
  return (ulong)(uint)((int)sVar5 + local_28);
}

Assistant:

uint32_t emsg::write(std::ostream &ostr) const
	{
		char int_buf[4];
		char long_buf[8];
		uint32_t bytes_written = 0;

		uint32_t sz = (uint32_t)this->size();
		fmp4_write_uint32(sz, int_buf);
		ostr.write((char *)int_buf, 4);
		bytes_written += 4;

		ostr.put('e');
		ostr.put('m');
		ostr.put('s');
		ostr.put('g');
		bytes_written += 4;
		ostr.put((uint8_t)version_);
		ostr.put(0u);
		ostr.put(0u);
		ostr.put(0u);
		bytes_written += 4;

		if (version_ == 1)
		{
			fmp4_write_uint32(timescale_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint64(presentation_time_, long_buf);
			ostr.write(long_buf, 8);
			bytes_written += 8;
			fmp4_write_uint32(event_duration_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(id_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			ostr.write(scheme_id_uri_.c_str(), scheme_id_uri_.size() + 1);
			bytes_written += (uint32_t)scheme_id_uri_.size() + 1;
			ostr.write(value_.c_str(), value_.size() + 1);
			bytes_written += (uint32_t)value_.size() + 1;
		}
		else
		{
			ostr.write(scheme_id_uri_.c_str(), scheme_id_uri_.size() + 1);
			bytes_written += (uint32_t)scheme_id_uri_.size() + 1;
			ostr.write(value_.c_str(), value_.size() + 1);
			bytes_written += (uint32_t)value_.size() + 1;
			fmp4_write_uint32(timescale_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(presentation_time_delta_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(event_duration_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
			fmp4_write_uint32(id_, int_buf);
			ostr.write(int_buf, 4);
			bytes_written += 4;
		}
		if (message_data_.size())
			ostr.write((char *)&message_data_[0], message_data_.size());
		
		bytes_written += (uint32_t)message_data_.size();
		return bytes_written;
	}